

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * ghc::filesystem::canonical(path *__return_storage_ptr__,path *p,error_code *ec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  impl_string_type *piVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  error_category *peVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ulong uVar10;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var11;
  int *piVar12;
  size_type sVar13;
  char *pcVar14;
  bool bVar15;
  path result;
  path local_1d0;
  path work;
  ulong local_190;
  path pe;
  path target;
  file_status fs;
  iterator __begin3;
  iterator __end3;
  
  uVar10 = (p->_path)._M_string_length;
  if (uVar10 == 0) {
    peVar8 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar8;
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  if (uVar10 < 3) {
    uVar7 = 0;
LAB_00104e15:
    pcVar14 = (p->_path)._M_dataplus._M_p;
    if (pcVar14[uVar7] != '/') goto LAB_00104e3d;
LAB_00104e1f:
    work._path._M_dataplus._M_p = (pointer)&work._path.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&work,pcVar14,pcVar14 + uVar10);
  }
  else {
    pcVar14 = (p->_path)._M_dataplus._M_p;
    if (*pcVar14 == '/') {
      if (((pcVar14[1] != '/') || (pcVar14[2] == 0x2f)) ||
         (iVar5 = isprint((int)pcVar14[2]), iVar5 == 0)) goto LAB_00104e1f;
      uVar7 = std::__cxx11::string::find((char)p,0x2f);
      uVar10 = (p->_path)._M_string_length;
      if (uVar7 == 0xffffffffffffffff) {
        uVar7 = uVar10;
      }
      if (uVar7 < uVar10) goto LAB_00104e15;
    }
LAB_00104e3d:
    absolute(&work,p,ec);
  }
  local_1d0._path._M_dataplus._M_p = (pointer)((long)&local_1d0 + 0x10);
  local_1d0._path._M_string_length = 0;
  local_1d0._path.field_2._M_local_buf[0] = '\0';
  detail::status_ex((path *)&fs,(error_code *)&work,(file_status *)ec,(uintmax_t *)0x0,
                    (uintmax_t *)0x0,(time_t *)0x0,0);
  if (ec->_M_value == 0) {
    if (fs._type != not_found) {
      paVar9 = &target._path.field_2;
      paVar1 = &(__return_storage_ptr__->_path).field_2;
      do {
        if (work._path._M_string_length < 3) {
          sVar13 = 0;
          uVar10 = 0;
LAB_00104fc0:
          if (uVar10 < work._path._M_string_length) {
            local_190 = (ulong)(work._path._M_dataplus._M_p[uVar10] == '/');
          }
          else {
LAB_00104fda:
            local_190 = 0;
          }
        }
        else {
          if (((*work._path._M_dataplus._M_p == '/') && (work._path._M_dataplus._M_p[1] == '/')) &&
             (work._path._M_dataplus._M_p[2] != 0x2f)) {
            iVar5 = isprint((int)work._path._M_dataplus._M_p[2]);
            if (iVar5 == 0) {
              sVar13 = 0;
            }
            else {
              sVar13 = std::__cxx11::string::find((char)&work,0x2f);
              if (sVar13 == 0xffffffffffffffff) {
                sVar13 = work._path._M_string_length;
              }
              if (work._path._M_string_length < 3) {
                uVar10 = 0;
                goto LAB_00104fc0;
              }
            }
          }
          else {
            sVar13 = 0;
          }
          if (*work._path._M_dataplus._M_p != '/') goto LAB_00104fda;
          local_190 = 1;
          if (((work._path._M_dataplus._M_p[1] == '/') && (work._path._M_dataplus._M_p[2] != 0x2f))
             && (iVar5 = isprint((int)work._path._M_dataplus._M_p[2]), iVar5 != 0)) {
            uVar10 = std::__cxx11::string::find((char)&work,0x2f);
            if (uVar10 == 0xffffffffffffffff) {
              uVar10 = work._path._M_string_length;
            }
            goto LAB_00104fc0;
          }
        }
        local_1d0._path._M_string_length = 0;
        *local_1d0._path._M_dataplus._M_p = '\0';
        target._path._M_dataplus = work._path._M_dataplus;
        path::iterator::iterator(&__begin3,&work,(const_iterator *)&target);
        target._path._M_dataplus._M_p = work._path._M_dataplus._M_p + work._path._M_string_length;
        path::iterator::iterator(&__end3,&work,(const_iterator *)&target);
        bVar4 = false;
        while (__begin3._iter._M_current != __end3._iter._M_current) {
          pe._path._M_dataplus._M_p = (pointer)&pe._path.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&pe,__begin3._current._path._M_dataplus._M_p,
                     __begin3._current._path._M_dataplus._M_p +
                     __begin3._current._path._M_string_length);
          iVar5 = 5;
          if (pe._path._M_string_length != 0) {
            target._path._M_dataplus._M_p = (pointer)paVar9;
            std::__cxx11::string::_M_construct<char_const*>((string *)&target,".","");
            if ((((target._path._M_string_length < 3) || (*target._path._M_dataplus._M_p != '/')) ||
                (target._path._M_dataplus._M_p[1] != '/')) ||
               (target._path._M_dataplus._M_p[2] == '/')) {
              _Var11 = std::
                       __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                                 (target._path._M_dataplus._M_p,
                                  target._path._M_dataplus._M_p + target._path._M_string_length);
            }
            else {
              _Var11 = std::
                       __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                                 (target._path._M_dataplus._M_p + 2,
                                  target._path._M_dataplus._M_p + target._path._M_string_length);
            }
            target._path._M_string_length =
                 (long)_Var11._M_current - (long)target._path._M_dataplus._M_p;
            *_Var11._M_current = '\0';
            iVar6 = path::compare(&pe,&target);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)target._path._M_dataplus._M_p != paVar9) {
              operator_delete(target._path._M_dataplus._M_p,
                              target._path.field_2._M_allocated_capacity + 1);
            }
            if (iVar6 != 0) {
              target._path._M_dataplus._M_p = (pointer)paVar9;
              std::__cxx11::string::_M_construct<char_const*>((string *)&target,"..","");
              if (((target._path._M_string_length < 3) || (*target._path._M_dataplus._M_p != '/'))
                 || ((target._path._M_dataplus._M_p[1] != '/' ||
                     (target._path._M_dataplus._M_p[2] == '/')))) {
                _Var11 = std::
                         __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                                   (target._path._M_dataplus._M_p,
                                    target._path._M_dataplus._M_p + target._path._M_string_length);
              }
              else {
                _Var11 = std::
                         __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                                   (target._path._M_dataplus._M_p + 2,
                                    target._path._M_dataplus._M_p + target._path._M_string_length);
              }
              target._path._M_string_length =
                   (long)_Var11._M_current - (long)target._path._M_dataplus._M_p;
              *_Var11._M_current = '\0';
              iVar6 = path::compare(&pe,&target);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)target._path._M_dataplus._M_p != paVar9) {
                operator_delete(target._path._M_dataplus._M_p,
                                target._path.field_2._M_allocated_capacity + 1);
              }
              if (iVar6 == 0) {
                path::parent_path(&target,&local_1d0);
                std::__cxx11::string::operator=((string *)&local_1d0,(string *)&target);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)target._path._M_dataplus._M_p != paVar9) {
                  operator_delete(target._path._M_dataplus._M_p,
                                  target._path.field_2._M_allocated_capacity + 1);
                }
              }
              else {
                result._path._M_dataplus._M_p = (pointer)&result._path.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&result,local_1d0._path._M_dataplus._M_p,
                           local_1d0._path._M_dataplus._M_p + local_1d0._path._M_string_length);
                path::operator/=(&result,&pe);
                target._path._M_dataplus._M_p = (pointer)paVar9;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&target,result._path._M_dataplus._M_p,
                           result._path._M_dataplus._M_p + result._path._M_string_length);
                sVar3 = target._path._M_string_length;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)target._path._M_dataplus._M_p != paVar9) {
                  operator_delete(target._path._M_dataplus._M_p,
                                  target._path.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)result._path._M_dataplus._M_p != &result._path.field_2) {
                  operator_delete(result._path._M_dataplus._M_p,
                                  result._path.field_2._M_allocated_capacity + 1);
                }
                if (local_190 + sVar13 < sVar3) {
                  result._path._M_dataplus._M_p = (pointer)&result._path.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&result,local_1d0._path._M_dataplus._M_p,
                             local_1d0._path._M_dataplus._M_p + local_1d0._path._M_string_length);
                  path::operator/=(&result,&pe);
                  iVar5 = lstat(result._path._M_dataplus._M_p,(stat *)&target);
                  if (iVar5 == 0) {
                    peVar8 = (error_category *)std::_V2::system_category();
                    ec->_M_value = 0;
                    ec->_M_cat = peVar8;
                    bVar15 = (target._path.field_2._8_4_ & 0xf000) == 0xa000;
                    iVar5 = 0;
                  }
                  else {
                    piVar12 = __errno_location();
                    iVar5 = *piVar12;
                    peVar8 = (error_category *)std::_V2::system_category();
                    ec->_M_value = iVar5;
                    ec->_M_cat = peVar8;
                    bVar15 = false;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)result._path._M_dataplus._M_p != &result._path.field_2) {
                    operator_delete(result._path._M_dataplus._M_p,
                                    result._path.field_2._M_allocated_capacity + 1);
                    iVar5 = ec->_M_value;
                  }
                  if (iVar5 == 0) {
                    if (bVar15) {
                      result._path._M_dataplus._M_p = (pointer)&result._path.field_2;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&result,local_1d0._path._M_dataplus._M_p,
                                 local_1d0._path._M_dataplus._M_p + local_1d0._path._M_string_length
                                );
                      path::operator/=(&result,&pe);
                      read_symlink(&target,&result,ec);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)result._path._M_dataplus._M_p != &result._path.field_2) {
                        operator_delete(result._path._M_dataplus._M_p,
                                        result._path.field_2._M_allocated_capacity + 1);
                      }
                      if (ec->_M_value == 0) {
                        if (target._path._M_string_length < 3) {
                          uVar10 = 0;
LAB_001054e5:
                          if ((target._path._M_string_length <= uVar10) ||
                             (target._path._M_dataplus._M_p[uVar10] != '/')) {
LAB_0010550d:
                            iVar5 = 5;
                            path::operator/=(&local_1d0,&target);
                            goto LAB_00105520;
                          }
                        }
                        else {
                          if (*target._path._M_dataplus._M_p != '/') goto LAB_0010550d;
                          if (((target._path._M_dataplus._M_p[1] == '/') &&
                              (target._path._M_dataplus._M_p[2] != 0x2f)) &&
                             (iVar5 = isprint((int)target._path._M_dataplus._M_p[2]), iVar5 != 0)) {
                            uVar10 = std::__cxx11::string::find((char)(stat *)&target,0x2f);
                            if (uVar10 == 0xffffffffffffffff) {
                              uVar10 = target._path._M_string_length;
                            }
                            goto LAB_001054e5;
                          }
                        }
                        iVar5 = 5;
                        std::__cxx11::string::_M_assign((string *)&local_1d0);
                      }
                      else {
                        (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
                        (__return_storage_ptr__->_path)._M_string_length = 0;
                        (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
                        iVar5 = 1;
                      }
LAB_00105520:
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)target._path._M_dataplus._M_p != paVar9) {
                        operator_delete(target._path._M_dataplus._M_p,
                                        target._path.field_2._M_allocated_capacity + 1);
                      }
                      bVar4 = true;
                    }
                    else {
                      iVar5 = 0;
                      path::operator/=(&local_1d0,&pe);
                    }
                  }
                  else {
                    (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
                    (__return_storage_ptr__->_path)._M_string_length = 0;
                    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
                    iVar5 = 1;
                  }
                }
                else {
                  path::operator/=(&local_1d0,&pe);
                }
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pe._path._M_dataplus._M_p != &pe._path.field_2) {
            operator_delete(pe._path._M_dataplus._M_p,pe._path.field_2._M_allocated_capacity + 1);
          }
          if ((iVar5 != 5) && (iVar5 != 0)) goto LAB_0010558e;
          path::iterator::operator++(&__begin3);
        }
        iVar5 = 4;
LAB_0010558e:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__end3._current._path._M_dataplus._M_p != &__end3._current._path.field_2) {
          operator_delete(__end3._current._path._M_dataplus._M_p,
                          __end3._current._path.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__begin3._current._path._M_dataplus._M_p != &__begin3._current._path.field_2) {
          operator_delete(__begin3._current._path._M_dataplus._M_p,
                          __begin3._current._path.field_2._M_allocated_capacity + 1);
        }
        if (iVar5 != 0) {
          if (iVar5 != 4) goto LAB_00104ebf;
          std::__cxx11::string::_M_assign((string *)&work);
        }
      } while (bVar4);
      peVar8 = (error_category *)std::_V2::system_category();
      ec->_M_value = 0;
      ec->_M_cat = peVar8;
      (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar1;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)&local_1d0 + 0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._path._M_dataplus._M_p == paVar9) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_1d0._path.field_2._M_allocated_capacity._1_7_,
                      local_1d0._path.field_2._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->_path).field_2 + 8) =
             local_1d0._path.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_path)._M_dataplus._M_p = local_1d0._path._M_dataplus._M_p;
        (__return_storage_ptr__->_path).field_2._M_allocated_capacity =
             CONCAT71(local_1d0._path.field_2._M_allocated_capacity._1_7_,
                      local_1d0._path.field_2._M_local_buf[0]);
      }
      piVar2 = &local_1d0._path;
      (__return_storage_ptr__->_path)._M_string_length = local_1d0._path._M_string_length;
      local_1d0._path._M_dataplus._M_p = (pointer)paVar9;
      goto LAB_00104eb5;
    }
    peVar8 = (error_category *)std::_V2::system_category();
    ec->_M_value = 2;
    ec->_M_cat = peVar8;
  }
  paVar9 = &(__return_storage_ptr__->_path).field_2;
  (__return_storage_ptr__->_path)._M_dataplus._M_p = (pointer)paVar9;
  piVar2 = &__return_storage_ptr__->_path;
LAB_00104eb5:
  piVar2->_M_string_length = 0;
  paVar9->_M_local_buf[0] = '\0';
LAB_00104ebf:
  if (local_1d0._path._M_dataplus._M_p != (pointer)((long)&local_1d0 + 0x10)) {
    operator_delete(local_1d0._path._M_dataplus._M_p,
                    CONCAT71(local_1d0._path.field_2._M_allocated_capacity._1_7_,
                             local_1d0._path.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)work._path._M_dataplus._M_p != &work._path.field_2) {
    operator_delete(work._path._M_dataplus._M_p,work._path.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path canonical(const path& p, std::error_code& ec)
{
    if (p.empty()) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    path work = p.is_absolute() ? p : absolute(p, ec);
    path result;

    auto fs = status(work, ec);
    if (ec) {
        return path();
    }
    if (fs.type() == file_type::not_found) {
        ec = detail::make_error_code(detail::portable_error::not_found);
        return path();
    }
    bool redo;
    do {
        auto rootPathLen = work._prefixLength + work.root_name_length() + (work.has_root_directory() ? 1 : 0);
        redo = false;
        result.clear();
        for (auto pe : work) {
            if (pe.empty() || pe == ".") {
                continue;
            }
            else if (pe == "..") {
                result = result.parent_path();
                continue;
            }
            else if ((result / pe).string().length() <= rootPathLen) {
                result /= pe;
                continue;
            }
            auto sls = symlink_status(result / pe, ec);
            if (ec) {
                return path();
            }
            if (is_symlink(sls)) {
                redo = true;
                auto target = read_symlink(result / pe, ec);
                if (ec) {
                    return path();
                }
                if (target.is_absolute()) {
                    result = target;
                    continue;
                }
                else {
                    result /= target;
                    continue;
                }
            }
            else {
                result /= pe;
            }
        }
        work = result;
    } while (redo);
    ec.clear();
    return result;
}